

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

__pid_t __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::wait
          (thread_pool<(unsigned_char)__x00_> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> tasks_lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->tasks_mutex);
  this->waiting = true;
  std::condition_variable::wait<BS::thread_pool<(unsigned_char)0>::wait()::_lambda()_1_>
            (&this->tasks_done_cv,&local_20,(anon_class_8_1_8991fb9c)this);
  this->waiting = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_EAX;
}

Assistant:

void wait()
    {
#ifdef __cpp_exceptions
        if constexpr (wait_deadlock_checks_enabled)
        {
            if (this_thread::get_pool() == this)
                throw wait_deadlock();
        }
#endif
        std::unique_lock tasks_lock(tasks_mutex);
        waiting = true;
        tasks_done_cv.wait(tasks_lock,
            [this]
            {
                if constexpr (pause_enabled)
                    return (tasks_running == 0) && (paused || tasks.empty());
                else
                    return (tasks_running == 0) && tasks.empty();
            });
        waiting = false;
    }